

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDual.c
# Opt level: O3

Aig_Man_t *
Saig_ManDupDual(Aig_Man_t *pAig,Vec_Int_t *vDcFlops,int nDualPis,int fDualFfs,int fMiterFfs,
               int fComplPo,int fCheckZero,int fCheckOne)

{
  int iVar1;
  char *__s;
  void *pvVar2;
  uint uVar3;
  uint *__ptr;
  ulong *__s_00;
  Aig_Man_t *p;
  size_t sVar4;
  char *__dest;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  
  if (pAig->nTruePos < 1) {
    __assert_fail("Saig_ManPoNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                  ,0x57,
                  "Aig_Man_t *Saig_ManDupDual(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int)"
                 );
  }
  if ((nDualPis < 0) || (pAig->nTruePis < nDualPis)) {
    __assert_fail("nDualPis >= 0 && nDualPis <= Saig_ManPiNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                  ,0x58,
                  "Aig_Man_t *Saig_ManDupDual(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int)"
                 );
  }
  if ((vDcFlops != (Vec_Int_t *)0x0) && (vDcFlops->nSize != pAig->nRegs)) {
    __assert_fail("vDcFlops == NULL || Vec_IntSize(vDcFlops) == Aig_ManRegNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                  ,0x59,
                  "Aig_Man_t *Saig_ManDupDual(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int)"
                 );
  }
  lVar14 = (long)pAig->vObjs->nSize - (long)pAig->nDeleted;
  iVar13 = (int)lVar14;
  uVar3 = iVar13 * 2;
  __ptr = (uint *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar3 - 1) {
    uVar12 = uVar3;
  }
  *__ptr = uVar12;
  if (uVar12 == 0) {
    __s_00 = (ulong *)0x0;
  }
  else {
    __s_00 = (ulong *)malloc((long)(int)uVar12 << 3);
  }
  *(ulong **)(__ptr + 2) = __s_00;
  __ptr[1] = uVar3;
  __dest = (char *)0x0;
  memset(__s_00,0,lVar14 * 0x10);
  p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  __s = pAig->pName;
  if (__s != (char *)0x0) {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  if (iVar13 < 1) {
LAB_006e694d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  *__s_00 = (ulong)p->pConst1 ^ 1;
  __s_00[1] = (ulong)p->pConst1;
  pVVar11 = pAig->vCis;
  if (0 < pVVar11->nSize) {
    uVar15 = 0;
    do {
      pvVar2 = pVVar11->pArray[uVar15];
      if (uVar15 < (uint)nDualPis) {
        pAVar5 = Aig_ObjCreateCi(p);
        pAVar6 = Aig_ObjCreateCi(p);
      }
      else {
        iVar13 = pAig->nTruePis;
        pAVar8 = Aig_ObjCreateCi(p);
        if ((long)uVar15 < (long)iVar13) {
          pAVar5 = (Aig_Obj_t *)((ulong)pAVar8 ^ 1);
          pAVar6 = pAVar8;
        }
        else {
          pAVar6 = Aig_ObjCreateCi(p);
          if (vDcFlops == (Vec_Int_t *)0x0) {
            pAVar5 = (Aig_Obj_t *)((ulong)pAVar8 ^ (ulong)(fDualFfs == 0));
          }
          else {
            uVar7 = (uint)-pAig->nTruePis + uVar15;
            iVar13 = (int)uVar7;
            if ((iVar13 < 0) || (vDcFlops->nSize <= iVar13)) goto LAB_006e696c;
            pAVar5 = (Aig_Obj_t *)
                     ((ulong)(vDcFlops->pArray[uVar7 & 0xffffffff] == 0) ^ (ulong)pAVar8);
          }
        }
      }
      iVar13 = *(int *)((long)pvVar2 + 0x24);
      pAVar8 = Aig_And(p,pAVar5,(Aig_Obj_t *)((ulong)pAVar6 ^ 1));
      if ((iVar13 < 0) || (uVar12 = iVar13 * 2, (int)uVar3 <= (int)uVar12)) goto LAB_006e694d;
      __s_00[uVar12] = (ulong)pAVar8;
      iVar13 = *(int *)((long)pvVar2 + 0x24);
      pAVar8 = Aig_And(p,pAVar6,(Aig_Obj_t *)((ulong)pAVar5 ^ 1));
      if ((iVar13 < 0) || (uVar12 = iVar13 * 2 + 1, uVar3 <= uVar12)) goto LAB_006e694d;
      __s_00[uVar12] = (ulong)pAVar8;
      uVar15 = uVar15 + 1;
      pVVar11 = pAig->vCis;
    } while ((long)uVar15 < (long)pVVar11->nSize);
  }
  pVVar11 = pAig->vObjs;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      pvVar2 = pVVar11->pArray[lVar14];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        uVar15 = *(ulong *)((long)pvVar2 + 8);
        if ((uVar15 == 0) ||
           (((iVar13 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24), iVar13 < 0 ||
             (uVar12 = iVar13 * 2, (int)uVar3 <= (int)uVar12)) || (uVar3 <= (uVar12 | 1)))))
        goto LAB_006e692e;
        pAVar8 = (Aig_Obj_t *)__s_00[uVar12];
        pAVar6 = (Aig_Obj_t *)__s_00[uVar12 | 1];
        pAVar5 = pAVar8;
        if ((uVar15 & 1) != 0) {
          pAVar9 = Aig_Or(p,pAVar8,pAVar6);
          pAVar5 = Aig_And(p,pAVar6,pAVar9);
          pAVar6 = Aig_And(p,pAVar8,pAVar9);
        }
        uVar15 = *(ulong *)((long)pvVar2 + 0x10);
        if (((uVar15 == 0) || (iVar13 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24), iVar13 < 0))
           || ((uVar12 = iVar13 * 2, (int)uVar3 <= (int)uVar12 || (uVar3 <= (uVar12 | 1)))))
        goto LAB_006e692e;
        pAVar8 = (Aig_Obj_t *)__s_00[uVar12];
        pAVar9 = (Aig_Obj_t *)__s_00[uVar12 | 1];
        pAVar10 = pAVar8;
        if ((uVar15 & 1) != 0) {
          p1 = Aig_Or(p,pAVar8,pAVar9);
          pAVar10 = Aig_And(p,pAVar9,p1);
          pAVar9 = Aig_And(p,pAVar8,p1);
        }
        iVar13 = *(int *)((long)pvVar2 + 0x24);
        pAVar8 = Aig_Or(p,pAVar5,pAVar10);
        if ((iVar13 < 0) || (uVar12 = iVar13 * 2, (int)uVar3 <= (int)uVar12)) goto LAB_006e694d;
        __s_00[uVar12] = (ulong)pAVar8;
        iVar13 = *(int *)((long)pvVar2 + 0x24);
        pAVar8 = Aig_And(p,pAVar6,pAVar9);
        if ((iVar13 < 0) || (uVar12 = iVar13 * 2 + 1, uVar3 <= uVar12)) goto LAB_006e694d;
        __s_00[uVar12] = (ulong)pAVar8;
        pVVar11 = pAig->vObjs;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar11->nSize);
  }
  pAVar8 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
  if (fMiterFfs == 0) {
    if (0 < pAig->nTruePos) {
      lVar14 = 0;
      do {
        if (((pAig->vCos->nSize <= lVar14) ||
            (uVar15 = *(ulong *)((long)pAig->vCos->pArray[lVar14] + 8), uVar15 == 0)) ||
           (iVar13 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24), iVar13 < 0)) goto LAB_006e692e;
        uVar3 = iVar13 * 2;
        if (((int)__ptr[1] <= (int)uVar3) || (__ptr[1] <= (uVar3 | 1))) goto LAB_006e692e;
        pAVar6 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)uVar3 * 8);
        pAVar5 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)(uVar3 | 1) * 8);
        pAVar9 = pAVar6;
        if ((uVar15 & 1) != 0) {
          pAVar10 = Aig_Or(p,pAVar6,pAVar5);
          pAVar9 = Aig_And(p,pAVar5,pAVar10);
          pAVar5 = Aig_And(p,pAVar6,pAVar10);
        }
        if (fCheckZero == 0) {
          pAVar9 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
          if (fCheckOne == 0) {
            pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
          }
        }
        else {
          pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
        }
        pAVar6 = Aig_And(p,pAVar9,pAVar5);
        pAVar8 = Aig_Or(p,pAVar8,pAVar6);
        lVar14 = lVar14 + 1;
      } while (lVar14 < pAig->nTruePos);
    }
  }
  else if (0 < pAig->nRegs) {
    iVar13 = 0;
    do {
      uVar3 = pAig->nTruePos + iVar13;
      if ((((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) ||
         ((uVar15 = *(ulong *)((long)pAig->vCos->pArray[uVar3] + 8), uVar15 == 0 ||
          (iVar1 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24), iVar1 < 0)))) goto LAB_006e692e;
      uVar3 = iVar1 * 2;
      if (((int)__ptr[1] <= (int)uVar3) || (__ptr[1] <= (uVar3 | 1))) goto LAB_006e692e;
      pAVar6 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)uVar3 * 8);
      pAVar5 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)(uVar3 | 1) * 8);
      pAVar9 = pAVar6;
      if ((uVar15 & 1) != 0) {
        pAVar10 = Aig_Or(p,pAVar6,pAVar5);
        pAVar9 = Aig_And(p,pAVar5,pAVar10);
        pAVar5 = Aig_And(p,pAVar6,pAVar10);
      }
      if (fCheckZero == 0) {
        pAVar9 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
        if (fCheckOne == 0) {
          pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
        }
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
      }
      pAVar6 = Aig_And(p,pAVar9,pAVar5);
      pAVar8 = Aig_Or(p,pAVar8,pAVar6);
      iVar13 = iVar13 + 1;
    } while (iVar13 < pAig->nRegs);
  }
  Aig_ObjCreateCo(p,(Aig_Obj_t *)((long)fComplPo ^ (ulong)pAVar8));
  iVar13 = pAig->nRegs;
  if (0 < iVar13) {
    lVar14 = 0;
    do {
      uVar15 = (ulong)(uint)pAig->nTruePos + lVar14;
      iVar13 = (int)uVar15;
      if ((((iVar13 < 0) || (pAig->vCos->nSize <= iVar13)) ||
          (uVar15 = *(ulong *)((long)pAig->vCos->pArray[uVar15 & 0xffffffff] + 8), uVar15 == 0)) ||
         (iVar13 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24), iVar13 < 0)) {
LAB_006e692e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar3 = iVar13 * 2;
      if (((int)__ptr[1] <= (int)uVar3) || (__ptr[1] <= (uVar3 | 1))) goto LAB_006e692e;
      pAVar8 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)uVar3 * 8);
      pAVar6 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)(uVar3 | 1) * 8);
      pAVar5 = pAVar8;
      if ((uVar15 & 1) != 0) {
        pAVar9 = Aig_Or(p,pAVar8,pAVar6);
        pAVar5 = Aig_And(p,pAVar6,pAVar9);
        pAVar6 = Aig_And(p,pAVar8,pAVar9);
      }
      bVar16 = fDualFfs == 0;
      if (vDcFlops != (Vec_Int_t *)0x0) {
        if (vDcFlops->nSize <= lVar14) {
LAB_006e696c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        bVar16 = vDcFlops->pArray[lVar14] == 0;
      }
      Aig_ObjCreateCo(p,(Aig_Obj_t *)((ulong)bVar16 ^ (ulong)pAVar5));
      Aig_ObjCreateCo(p,pAVar6);
      lVar14 = lVar14 + 1;
      iVar13 = pAig->nRegs;
    } while (lVar14 < iVar13);
  }
  Aig_ManSetRegNum(p,iVar13 * 2);
  Aig_ManCleanup(p);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManDupDual( Aig_Man_t * pAig, Vec_Int_t * vDcFlops, int nDualPis, int fDualFfs, int fMiterFfs, int fComplPo, int fCheckZero, int fCheckOne )
{
    Vec_Ptr_t * vCopies;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pTemp0, * pTemp1, * pTemp2, * pTemp3, * pCare, * pMiter;
    int i;
    assert( Saig_ManPoNum(pAig) > 0 );
    assert( nDualPis >= 0 && nDualPis <= Saig_ManPiNum(pAig) );
    assert( vDcFlops == NULL || Vec_IntSize(vDcFlops) == Aig_ManRegNum(pAig) );
    vCopies = Vec_PtrStart( 2*Aig_ManObjNum(pAig) );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Saig_ObjSetDual( vCopies, 0, 0, Aig_ManConst0(pAigNew) );
    Saig_ObjSetDual( vCopies, 0, 1, Aig_ManConst1(pAigNew) );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
    {
        if ( i < nDualPis )
        {
            pTemp0 = Aig_ObjCreateCi( pAigNew );
            pTemp1 = Aig_ObjCreateCi( pAigNew );
        }
        else if ( i < Saig_ManPiNum(pAig) )
        {
            pTemp1 = Aig_ObjCreateCi( pAigNew );
            pTemp0 = Aig_Not( pTemp1 );
        }
        else
        {
            pTemp0 = Aig_ObjCreateCi( pAigNew );
            pTemp1 = Aig_ObjCreateCi( pAigNew );
            if ( vDcFlops )
                pTemp0 = Aig_NotCond( pTemp0, !Vec_IntEntry(vDcFlops, i-Saig_ManPiNum(pAig)) );
            else
                pTemp0 = Aig_NotCond( pTemp0, !fDualFfs );
        }
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 0, Aig_And(pAigNew, pTemp0, Aig_Not(pTemp1)) );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 1, Aig_And(pAigNew, pTemp1, Aig_Not(pTemp0)) );
    }
    // create internal nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 1, &pTemp2, &pTemp3 );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 0, Aig_Or (pAigNew, pTemp0, pTemp2) );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 1, Aig_And(pAigNew, pTemp1, pTemp3) );
    }
    // create miter and flops
    pMiter = Aig_ManConst0(pAigNew);
    if ( fMiterFfs )
    {
        Saig_ManForEachLi( pAig, pObj, i )
        {
            Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
            if ( fCheckZero )
            {
                pCare  = Aig_And( pAigNew, pTemp0, Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else if ( fCheckOne )
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), pTemp1 );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else // check X
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
        }
    }
    else
    {
        Saig_ManForEachPo( pAig, pObj, i )
        {
            Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
            if ( fCheckZero )
            {
                pCare  = Aig_And( pAigNew, pTemp0, Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else if ( fCheckOne )
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), pTemp1 );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else // check X
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
        }
    }
    // create PO
    pMiter = Aig_NotCond( pMiter, fComplPo );
    Aig_ObjCreateCo( pAigNew, pMiter );
    // create flops
    Saig_ManForEachLi( pAig, pObj, i )
    {
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
        if ( vDcFlops )
            pTemp0 = Aig_NotCond( pTemp0, !Vec_IntEntry(vDcFlops, i) );
        else
            pTemp0 = Aig_NotCond( pTemp0, !fDualFfs );
        Aig_ObjCreateCo( pAigNew, pTemp0 );
        Aig_ObjCreateCo( pAigNew, pTemp1 );
    }
    // set the flops
    Aig_ManSetRegNum( pAigNew, 2 * Aig_ManRegNum(pAig) );
    Aig_ManCleanup( pAigNew );
    Vec_PtrFree( vCopies );
    return pAigNew;
}